

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O3

void __thiscall SourceMapTest::parseMap(SourceMapTest *this,string *sourceMap)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pcVar1;
  pointer pcVar2;
  SourceMapReader *pSVar3;
  Module *pMVar4;
  pointer local_48;
  pointer pcStack_40;
  pointer local_38;
  allocator_type local_21;
  
  __first._M_current = (sourceMap->_M_dataplus)._M_p;
  std::vector<char,std::allocator<char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<char,std::allocator<char>> *)&local_48,__first,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + sourceMap->_M_string_length),&local_21);
  pcVar1 = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcStack_40;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_38;
  local_48 = (pointer)0x0;
  pcStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
  }
  pMVar4 = (Module *)operator_new(0x40);
  *(vector<char,_std::allocator<char>_> **)
   &(pMVar4->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       = &this->buffer;
  *(pointer *)((long)&pMVar4->exports + 8) = (pointer)0x0;
  *(pointer *)((long)&pMVar4->exports + 0x10) = (pointer)0x0;
  (pMVar4->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = 0;
  *(pointer *)((long)&pMVar4->functions + 8) = (pointer)0x0;
  *(pointer *)((long)&pMVar4->functions + 0x10) = (pointer)&DAT_100000000;
  (pMVar4->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined2 *)((long)&pMVar4->globals + 8) = 0;
  pSVar3 = (this->reader)._M_t.
           super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>
           .super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl;
  (this->reader)._M_t.
  super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>._M_t.
  super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>.
  super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl = (SourceMapReader *)pMVar4;
  if (pSVar3 != (SourceMapReader *)0x0) {
    operator_delete(pSVar3,0x40);
    pMVar4 = (Module *)
             (this->reader)._M_t.
             super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>
             .super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl;
  }
  ::wasm::SourceMapReader::parse(pMVar4);
  return;
}

Assistant:

void parseMap(std::string& sourceMap) {
    buffer = {sourceMap.begin(), sourceMap.end()};
    reader.reset(new SourceMapReader(buffer));
    reader->parse(wasm);
  }